

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_shsub8_arm(uint32_t a,uint32_t b)

{
  return ((int)(char)(a >> 8) - (int)(char)(b >> 8) & 0x1feU) << 7 |
         (((int)a >> 0x18) - ((int)b >> 0x18) & 0xfffffffeU) << 0x17 |
         (uint)((int)(char)a - (int)(char)b) >> 1 & 0xff |
         ((int)(char)(a >> 0x10) - (int)(char)(b >> 0x10) & 0x1feU) << 0xf;
}

Assistant:

uint32_t HELPER(glue(PFX,sub8))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB8(a, b, 0);
    SUB8(a >> 8, b >> 8, 1);
    SUB8(a >> 16, b >> 16, 2);
    SUB8(a >> 24, b >> 24, 3);
    SET_GE;
    return res;
}